

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rstarplanner.cpp
# Opt level: O3

void __thiscall RSTARPlanner::PrintSearchPath(RSTARPlanner *this,FILE *fOut)

{
  DiscreteSpaceInformation *pDVar1;
  ulong uVar2;
  ulong uVar3;
  int solcost;
  int local_4c;
  vector<int,_std::allocator<int>_> local_48;
  
  GetSearchPath(&local_48,this,&local_4c);
  uVar2 = (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
  if ((int)(uint)uVar2 < 1) {
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start == (pointer)0x0) {
      return;
    }
  }
  else {
    uVar3 = 0;
    do {
      if (uVar2 == uVar3) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar2
                   ,uVar2);
      }
      pDVar1 = (this->super_SBPLPlanner).environment_;
      (*pDVar1->_vptr_DiscreteSpaceInformation[0x12])
                (pDVar1,(ulong)(uint)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start[uVar3],0,fOut);
      uVar3 = uVar3 + 1;
    } while (((uint)uVar2 & 0x7fffffff) != uVar3);
  }
  operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
  return;
}

Assistant:

void RSTARPlanner::PrintSearchPath(FILE* fOut)
{
    vector<int> pathIds;
    int solcost;

    pathIds = GetSearchPath(solcost);

    SBPL_FPRINTF(fOut, "high-level solution cost = %d, solution length=%d\n", solcost, (unsigned int)pathIds.size());
    for (int sind = 0; sind < (int)pathIds.size(); sind++) {
        environment_->PrintState(pathIds.at(sind), false, fOut);
    }
}